

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.cpp
# Opt level: O3

void __thiscall
presolve::HighsPostsolveStack::compressIndexMaps
          (HighsPostsolveStack *this,vector<int,_std::allocator<int>_> *newRowIndex,
          vector<int,_std::allocator<int>_> *newColIndex)

{
  pointer piVar1;
  pointer piVar2;
  int iVar3;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar4;
  
  piVar1 = (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar1) >> 2;
  iVar3 = (int)uVar4;
  piVar2 = (newRowIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(newRowIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  if (lVar5 != 0) {
    lVar6 = 0;
    do {
      lVar7 = (long)piVar2[lVar6];
      if (lVar7 == -1) {
        uVar4 = (ulong)((int)uVar4 - 1);
      }
      else {
        piVar1[lVar7] = piVar1[lVar6];
      }
      iVar3 = (int)uVar4;
      lVar6 = lVar6 + 1;
    } while (lVar5 >> 2 != lVar6);
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->origRowIndex,(long)iVar3);
  piVar1 = (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar1) >> 2;
  iVar3 = (int)uVar4;
  piVar2 = (newColIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(newColIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  if (lVar5 != 0) {
    lVar6 = 0;
    do {
      lVar7 = (long)piVar2[lVar6];
      if (lVar7 == -1) {
        uVar4 = (ulong)((int)uVar4 - 1);
      }
      else {
        piVar1[lVar7] = piVar1[lVar6];
      }
      iVar3 = (int)uVar4;
      lVar6 = lVar6 + 1;
    } while (lVar5 >> 2 != lVar6);
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->origColIndex,(long)iVar3);
  return;
}

Assistant:

void HighsPostsolveStack::compressIndexMaps(
    const std::vector<HighsInt>& newRowIndex,
    const std::vector<HighsInt>& newColIndex) {
  // loop over rows, decrease row counter for deleted rows (marked with -1),
  // store original index at new index position otherwise
  HighsInt numRow = origRowIndex.size();
  for (size_t i = 0; i != newRowIndex.size(); ++i) {
    if (newRowIndex[i] == -1)
      --numRow;
    else
      origRowIndex[newRowIndex[i]] = origRowIndex[i];
  }
  // resize original index array to new size
  origRowIndex.resize(numRow);

  // now compress the column array
  HighsInt numCol = origColIndex.size();
  for (size_t i = 0; i != newColIndex.size(); ++i) {
    if (newColIndex[i] == -1)
      --numCol;
    else
      origColIndex[newColIndex[i]] = origColIndex[i];
  }
  origColIndex.resize(numCol);
}